

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodePredicateOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  
  DVar2 = MCDisassembler_Fail;
  if (Val != 0xf) {
    uVar1 = MCInst_getOpcode(Inst);
    if (Val != 0xe || uVar1 != 0xaa3) {
      MCOperand_CreateImm0(Inst,(ulong)Val);
      MCOperand_CreateReg0(Inst,(uint)(Val != 0xe) * 3);
      DVar2 = MCDisassembler_Success;
    }
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodePredicateOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	if (Val == 0xF) return MCDisassembler_Fail;
	// AL predicate is not allowed on Thumb1 branches.
	if (MCInst_getOpcode(Inst) == ARM_tBcc && Val == 0xE)
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, Val);
	if (Val == ARMCC_AL) {
		MCOperand_CreateReg0(Inst, 0);
	} else
		MCOperand_CreateReg0(Inst, ARM_CPSR);
	return MCDisassembler_Success;
}